

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> * __thiscall
duckdb::Binder::FindCTE
          (vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true>
           *__return_storage_ptr__,Binder *this,string *name,bool skip)

{
  pointer *pprVar1;
  size_t __n;
  int iVar2;
  iterator iVar3;
  pointer pSVar4;
  pointer pQVar5;
  Binder *this_00;
  iterator __position;
  bool skip_00;
  vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> parent_ctes;
  vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> local_40;
  
  iVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->CTE_bindings)._M_h,name);
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_true>
      ._M_cur == (__node_type *)0x0) goto LAB_00e17c34;
  if (skip) {
    pSVar4 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                           *)(*(long *)((long)iVar3.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_true>
                                              ._M_cur + 0x28) + 0x30));
    pQVar5 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       (&pSVar4->node);
    if (pQVar5->type != RECURSIVE_CTE_NODE) goto LAB_00e17c34;
    __position._M_current =
         (__return_storage_ptr__->
         super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
         ).
         super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (__return_storage_ptr__->
        super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
        ).
        super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      (__position._M_current)->_M_data =
           *(CommonTableExpressionInfo **)
            ((long)iVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_true>
                   ._M_cur + 0x28);
      pprVar1 = &(__return_storage_ptr__->
                 super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
      goto LAB_00e17c34;
    }
  }
  else {
    __position._M_current = (reference_wrapper<duckdb::CommonTableExpressionInfo> *)0x0;
  }
  ::std::
  vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>>
  ::_M_realloc_insert<std::reference_wrapper<duckdb::CommonTableExpressionInfo>const&>
            ((vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>>
              *)__return_storage_ptr__,__position,
             (reference_wrapper<duckdb::CommonTableExpressionInfo> *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_true>
                    ._M_cur + 0x28));
LAB_00e17c34:
  if (((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) && (this->binder_type == REGULAR_BINDER)) {
    this_00 = shared_ptr<duckdb::Binder,_true>::operator->(&this->parent);
    __n = name->_M_string_length;
    if (__n == (this->alias)._M_string_length) {
      if (__n == 0) {
        skip_00 = true;
      }
      else {
        iVar2 = bcmp((name->_M_dataplus)._M_p,(this->alias)._M_dataplus._M_p,__n);
        skip_00 = iVar2 == 0;
      }
    }
    else {
      skip_00 = false;
    }
    FindCTE(&local_40,this_00,name,skip_00);
    ::std::
    vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>*,std::vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>>>>
              ((vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               local_40.
               super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_40.
               super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (local_40.
        super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.
                      super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<reference<CommonTableExpressionInfo>> Binder::FindCTE(const string &name, bool skip) {
	auto entry = CTE_bindings.find(name);
	vector<reference<CommonTableExpressionInfo>> ctes;
	if (entry != CTE_bindings.end()) {
		if (!skip || entry->second.get().query->node->type == QueryNodeType::RECURSIVE_CTE_NODE) {
			ctes.push_back(entry->second);
		}
	}
	if (parent && binder_type == BinderType::REGULAR_BINDER) {
		auto parent_ctes = parent->FindCTE(name, name == alias);
		ctes.insert(ctes.end(), parent_ctes.begin(), parent_ctes.end());
	}
	return ctes;
}